

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pickup.c
# Opt level: O3

int lift_object(obj *obj,obj *container,long *cnt_p,boolean telekinesis)

{
  long lVar1;
  undefined1 auVar2 [16];
  char cVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  char *pcVar8;
  char *pcVar9;
  long lVar10;
  long lVar11;
  obj *poVar12;
  char *pcVar13;
  char *pcVar14;
  ulong uVar15;
  uint uVar16;
  ulong uVar17;
  long lVar18;
  uint uVar19;
  long lVar20;
  long lVar21;
  char *pcVar22;
  int iVar23;
  bool bVar24;
  bool bVar25;
  bool bVar26;
  uint local_238;
  undefined1 uStack_234;
  undefined2 uStack_233;
  undefined4 uStack_231;
  undefined4 uStack_22d;
  undefined4 uStack_229;
  char obj_nambuf [256];
  
  if (obj->otyp == 0x210) {
    return 1;
  }
  if (obj->otyp == 0x214) {
    if (u.uz.dnum == dungeon_topology.d_sokoban_dnum) {
      pcVar8 = body_part(6);
      pcVar9 = xname(obj);
      pline("You cannot get your %s around this %s.",pcVar8,pcVar9);
      return -1;
    }
    if (((youmonst.data)->mflags2 & 0x8000000) != 0) {
      return 1;
    }
  }
  lVar1 = *cnt_p;
  bVar24 = true;
  bVar25 = true;
  if (container != &zeroobj && container != (obj *)0x0) {
    bVar24 = container->where != '\x03';
    bVar25 = container->otyp != 0xe0;
  }
  cVar3 = obj->oclass;
  lVar10 = money_cnt(invent);
  uVar16 = obj->owt;
  iVar6 = obj->quan;
  iVar4 = max_capacity();
  if (lVar1 == iVar6) {
    uVar5 = obj->owt;
  }
  else {
    obj->quan = (int)lVar1;
    uVar5 = weight(obj);
    obj->owt = uVar5;
  }
  iVar23 = uVar5 + iVar4;
  if (!bVar24) {
    if (!bVar25) {
      if ((*(uint *)&container->field_0x4a & 1) == 0) {
        if ((*(uint *)&container->field_0x4a & 2) == 0) {
          uVar5 = uVar5 + 1 >> 1;
        }
        else {
          uVar5 = uVar5 + 3 >> 2;
        }
      }
      else {
        uVar5 = uVar5 * 2;
      }
    }
    iVar23 = iVar23 - uVar5;
  }
  if (cVar3 == '\f') {
    uVar15 = (SUB168(SEXT816(lVar10 + 0x32) * SEXT816(0x5c28f5c28f5c28f5),8) - lVar10) - 0x32;
    uVar17 = (SUB168(SEXT816(lVar1 + 0x32) * SEXT816(0x5c28f5c28f5c28f5),8) - lVar1) - 0x32;
    auVar2 = SEXT816(lVar10 + lVar1 + 0x32) * ZEXT816(0xa3d70a3d70a3d70b);
    iVar23 = iVar23 + ((int)(auVar2._8_8_ >> 6) - (auVar2._12_4_ >> 0x1f)) +
                      ((int)(uVar17 >> 6) - (int)((long)uVar17 >> 0x3f)) +
                      ((int)(uVar15 >> 6) - (int)((long)uVar15 >> 0x3f));
  }
  if (lVar1 != iVar6) {
    obj->quan = iVar6;
    obj->owt = uVar16;
  }
  if (iVar23 < 0) {
    *cnt_p = lVar1;
    if (0 < lVar1) goto LAB_00213c22;
  }
  else {
    if (cVar3 == '\f') {
      lVar20 = lVar10 + 0x32;
      uVar15 = (SUB168(SEXT816(lVar20) * SEXT816(0x5c28f5c28f5c28f5),8) - lVar10) - 0x32;
      uVar5 = ((int)(uVar15 >> 6) - (int)((long)uVar15 >> 0x3f)) + iVar4;
      if (bVar24) {
        lVar18 = ((long)(int)uVar5 * -100 - lVar10) + -0x33;
      }
      else {
        lVar18 = 0x31;
        if (0x31 < lVar10 % 100) {
          lVar18 = 0x95;
        }
        lVar18 = lVar18 - lVar10 % 100;
        iVar23 = 0;
        if (lVar18 <= lVar1) {
          iVar23 = 0;
          do {
            obj->quan = (int)lVar18;
            uVar15 = SUB168(SEXT816(lVar18 + 0x32) * SEXT816(-0x5c28f5c28f5c28f5),8) + lVar18 + 0x32
            ;
            uVar19 = (int)(uVar15 >> 6) - (int)((long)uVar15 >> 0x3f);
            obj->owt = uVar19;
            auVar2 = SEXT816(lVar20 + lVar18) * ZEXT816(0xa3d70a3d70a3d70b);
            if (!bVar25) {
              if ((*(uint *)&container->field_0x4a & 1) == 0) {
                if ((*(uint *)&container->field_0x4a & 2) == 0) {
                  uVar19 = uVar19 + 1 >> 1;
                }
                else {
                  uVar19 = uVar19 + 3 >> 2;
                }
              }
              else {
                uVar19 = uVar19 * 2;
              }
            }
            iVar7 = ((int)(auVar2._8_8_ >> 6) - (auVar2._12_4_ >> 0x1f)) - uVar19;
          } while ((iVar7 <= (int)~uVar5) &&
                  (lVar18 = lVar18 + 100, iVar23 = iVar7, lVar18 <= lVar1));
        }
        uVar5 = uVar5 - iVar23;
        lVar18 = lVar18 + -100;
      }
      lVar11 = lVar1;
      if (lVar18 < lVar1) {
        lVar11 = lVar18;
      }
      lVar21 = 0;
      if (-1 < lVar18) {
        lVar21 = lVar11;
      }
      auVar2 = SEXT816(lVar20 + lVar21) * ZEXT816(0xa3d70a3d70a3d70b);
      iVar23 = ((int)(auVar2._8_8_ >> 6) - (auVar2._12_4_ >> 0x1f)) + uVar5;
LAB_00213b04:
      obj->quan = iVar6;
      obj->owt = uVar16;
      if (lVar21 < lVar1) goto LAB_00213b17;
      local_238 = local_238 & 0xffffff00;
      obj_nambuf[0] = '\0';
      if (lVar21 < 1) {
LAB_00213d6b:
        obj_nambuf[0] = '\0';
        pcVar8 = "";
        goto LAB_00213d72;
      }
    }
    else {
      if (1 < lVar1) {
LAB_00213931:
        lVar20 = 1;
        do {
          obj->quan = (int)lVar20;
          uVar5 = weight(obj);
          obj->owt = uVar5;
          if (!bVar24) {
            uVar19 = uVar5;
            if (!bVar25) {
              if ((*(uint *)&container->field_0x4a & 1) == 0) {
                if ((*(uint *)&container->field_0x4a & 2) == 0) {
                  uVar19 = uVar5 + 1 >> 1;
                }
                else {
                  uVar19 = uVar5 + 3 >> 2;
                }
              }
              else {
                uVar19 = uVar5 * 2;
              }
            }
            uVar5 = uVar5 - uVar19;
          }
          iVar7 = uVar5 + iVar4;
          lVar21 = lVar20;
        } while ((iVar7 < 0) &&
                (bVar26 = lVar20 != lVar1, lVar21 = lVar1 + 1, lVar20 = lVar20 + 1, iVar23 = iVar7,
                bVar26));
        lVar21 = lVar21 + -1;
        goto LAB_00213b04;
      }
      if (lVar1 < obj->quan) {
        if (lVar1 == 1) goto LAB_00213931;
        obj->quan = iVar6;
        obj->owt = uVar16;
LAB_00213d5e:
        local_238 = local_238 & 0xffffff00;
        goto LAB_00213d6b;
      }
      obj->quan = iVar6;
      obj->owt = uVar16;
      if (lVar1 != 1) goto LAB_00213d5e;
      lVar21 = 0;
LAB_00213b17:
      pcVar8 = doname(obj);
      strcpy(obj_nambuf,pcVar8);
      if (container == (obj *)0x0) {
        local_238 = 0x6e69796c;
        uStack_234 = 0x67;
        uStack_233 = 0x6820;
        uStack_231 = 0x657265;
        pcVar8 = "acquire";
        if (telekinesis == '\0') {
          pcVar8 = "lift";
        }
      }
      else {
        if (container == &zeroobj) {
          local_238 = 0x74206e69;
          uStack_234 = 0x68;
          uStack_233 = 0x2065;
          uStack_231 = 0x6967616d;
          uStack_22d = 0x68632063;
          uStack_229 = 0x747365;
        }
        else {
          pcVar8 = xname(container);
          pcVar8 = the(pcVar8);
          sprintf((char *)&local_238,"in %s",pcVar8);
        }
        pcVar8 = "carry";
      }
      if (lVar21 < 1) {
LAB_00213d72:
        if (container == (obj *)0x0) {
          uStack_234 = 0;
          local_238 = 0x65726568;
        }
        if (invent == (obj *)0x0 && lVar10 == 0) {
          pcVar9 = "even one ";
          if (obj->quan == 1) {
            pcVar9 = "it ";
          }
          pcVar22 = "";
          pcVar13 = "is too heavy for you to ";
        }
        else {
          pcVar22 = " any more";
          pcVar13 = "";
          pcVar9 = "you cannot ";
        }
        pcVar14 = otense(obj,"are");
        pline("There %s %s %s, but %s%s%s%s.",pcVar14,obj_nambuf,&local_238,pcVar9,pcVar13,pcVar8,
              pcVar22);
        *cnt_p = 0;
        uVar16 = 0xffffffff;
        goto LAB_00213e22;
      }
      pcVar9 = "some";
      if (lVar21 == 1) {
        pcVar9 = "one";
      }
      pline("You can only %s %s of the %s %s.",pcVar8,pcVar9,obj_nambuf,&local_238);
    }
    *cnt_p = lVar21;
LAB_00213c22:
    iVar6 = inv_cnt();
    if ((iVar6 < 0x34) || (poVar12 = merge_choice(invent,obj), poVar12 != (obj *)0x0)) {
      iVar7 = near_capacity();
      iVar6 = flags.pickup_burden;
      if (flags.pickup_burden < iVar7) {
        iVar6 = iVar7;
      }
      iVar4 = calc_capacity(iVar23 - iVar4);
      if (iVar4 <= iVar6) {
        return 1;
      }
      uVar16 = 0;
      if (telekinesis == '\0') {
        pcVar8 = "You have a little trouble lifting";
        if (iVar4 == 3) {
          pcVar8 = "You have much trouble lifting";
        }
        iVar6 = obj->quan;
        obj->quan = (int)*cnt_p;
        pcVar9 = "You have extreme difficulty lifting";
        if (iVar4 < 4) {
          pcVar9 = pcVar8;
        }
        strcpy(obj_nambuf,pcVar9);
        pcVar8 = eos(obj_nambuf);
        pcVar9 = doname(obj);
        pcVar13 = simple_typename((int)obj->otyp);
        pcVar13 = an(pcVar13);
        pcVar9 = safe_qbuf(obj_nambuf,0xd,pcVar9,pcVar13,"something");
        sprintf(pcVar8," %s. Continue?",pcVar9);
        obj->quan = iVar6;
        cVar3 = yn_function(obj_nambuf,"ynq",'q');
        uVar16 = 0xffffffff;
        if (cVar3 != 'q') {
          uVar16 = (uint)(cVar3 != 'n');
        }
      }
      goto LAB_00213e22;
    }
    pline("Your knapsack cannot accommodate any more items.");
  }
  uVar16 = 0xffffffff;
LAB_00213e22:
  if (((container == (obj *)0x0) && ((int)uVar16 < 1)) && (obj->otyp == 0x155)) {
    obj->spe = '\0';
  }
  return uVar16;
}

Assistant:

static int lift_object(struct obj *obj, struct obj *container,
		       long *cnt_p, boolean telekinesis)
{
    int result, old_wt, new_wt, prev_encumbr, next_encumbr;

    if (obj->otyp == BOULDER && In_sokoban(&u.uz)) {
	pline("You cannot get your %s around this %s.",
			body_part(HAND), xname(obj));
	return -1;
    }
    if (obj->otyp == LOADSTONE ||
	    (obj->otyp == BOULDER && throws_rocks(youmonst.data)))
	return 1;		/* lift regardless of current situation */

    *cnt_p = carry_count(obj, container, *cnt_p, telekinesis, &old_wt, &new_wt);
    if (*cnt_p < 1L) {
	result = -1;	/* nothing lifted */
    } else if (inv_cnt() >= 52 && !merge_choice(invent, obj)) {
	pline("Your knapsack cannot accommodate any more items.");
	result = -1;	/* nothing lifted */
    } else {
	result = 1;
	prev_encumbr = near_capacity();
	if (prev_encumbr < flags.pickup_burden)
		prev_encumbr = flags.pickup_burden;
	next_encumbr = calc_capacity(new_wt - old_wt);
	if (next_encumbr > prev_encumbr) {
	    if (telekinesis) {
		result = 0;	/* don't lift */
	    } else {
		char qbuf[BUFSZ];
		long savequan = obj->quan;

		obj->quan = *cnt_p;
		strcpy(qbuf,
			(next_encumbr > HVY_ENCUMBER) ? overloadmsg :
			(next_encumbr > MOD_ENCUMBER) ? nearloadmsg :
			moderateloadmsg);
		sprintf(eos(qbuf), " %s. Continue?",
			safe_qbuf(qbuf, sizeof(" . Continue?"),
				doname(obj), an(simple_typename(obj->otyp)), "something"));
		obj->quan = savequan;
		switch (ynq(qbuf)) {
		    case 'q':  result = -1; break;
		    case 'n':  result =  0; break;
		    default:   break;	/* 'y' => result == 1 */
		}
	    }
	}
    }

    if (obj->otyp == SCR_SCARE_MONSTER && result <= 0 && !container)
	obj->spe = 0;
    return result;
}